

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sigmoid.cpp
# Opt level: O3

int __thiscall ncnn::Sigmoid::forward_inplace(Sigmoid *this,Mat *bottom_top_blob,Option *opt)

{
  int iVar1;
  size_t sVar2;
  size_t sVar3;
  ulong uVar4;
  long lVar5;
  uint uVar6;
  void *pvVar7;
  float fVar8;
  
  iVar1 = bottom_top_blob->c;
  if (0 < (long)iVar1) {
    uVar6 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d;
    pvVar7 = bottom_top_blob->data;
    sVar2 = bottom_top_blob->cstep;
    sVar3 = bottom_top_blob->elemsize;
    lVar5 = 0;
    do {
      if (0 < (int)uVar6) {
        uVar4 = 0;
        do {
          fVar8 = *(float *)((long)pvVar7 + uVar4 * 4);
          if (88.37626 <= fVar8) {
            fVar8 = 88.37626;
          }
          fVar8 = expf((float)(-(uint)(fVar8 < -88.37626) & 0x42b0c0a5 |
                              ~-(uint)(fVar8 < -88.37626) & (uint)-fVar8));
          *(float *)((long)pvVar7 + uVar4 * 4) = 1.0 / (fVar8 + 1.0);
          uVar4 = uVar4 + 1;
        } while (uVar6 != uVar4);
      }
      lVar5 = lVar5 + 1;
      pvVar7 = (void *)((long)pvVar7 + sVar2 * sVar3);
    } while (lVar5 != iVar1);
  }
  return 0;
}

Assistant:

int Sigmoid::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int d = bottom_top_blob.d;
    int channels = bottom_top_blob.c;
    int size = w * h * d;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        for (int i = 0; i < size; i++)
        {
            float v = ptr[i];
            v = std::min(v, 88.3762626647949f);
            v = std::max(v, -88.3762626647949f);
            ptr[i] = 1.f / (1.f + expf(-v));
        }
    }

    return 0;
}